

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O0

int expand_warning(dmr_C *C,expression *expr,int cost)

{
  expression *peVar1;
  symbol *psVar2;
  string *string;
  symbol *sym;
  ptr_list_iter argiter__;
  expression_list *arglist;
  expression *arg;
  int cost_local;
  expression *expr_local;
  dmr_C *C_local;
  
  argiter__._16_8_ = (expr->field_5).field_2.string;
  ptrlist_forward_iterator((ptr_list_iter *)&sym,(ptr_list *)argiter__._16_8_);
  arglist = (expression_list *)ptrlist_iter_next((ptr_list_iter *)&sym);
  while (arglist != (expression_list *)0x0) {
    if ((undefined1  [264])((undefined1  [264])*arglist & (undefined1  [264])0xff) ==
        (undefined1  [264])0x3) {
      peVar1 = arglist->list_[0];
      if ((peVar1[2].field_5.field_10.cond_false != (expression *)0x0) &&
         ((undefined1  [64])
          ((undefined1  [64])*peVar1[2].field_5.field_10.cond_false & (undefined1  [64])0xff) ==
          (undefined1  [64])0x2)) {
        psVar2 = (peVar1[2].field_5.field_14.field)->replace;
        dmrC_warning(C,expr->pos,"%*s",(ulong)((*(uint *)psVar2 & 0x7fffffff) - 1),&psVar2->pos);
      }
    }
    else if (((undefined1  [264])((undefined1  [264])*arglist & (undefined1  [264])0xff) !=
              (undefined1  [264])0x1) || (arglist->list_[0] == (expression *)0x0)) break;
    arglist = (expression_list *)ptrlist_iter_next((ptr_list_iter *)&sym);
  }
  *(ushort *)expr = *(ushort *)expr & 0xff00 | 1;
  (expr->field_5).field_0.value = 1;
  (expr->field_5).field_0.taint = 0;
  return 0;
}

Assistant:

static int expand_warning(struct dmr_C *C, struct expression *expr, int cost)
{
	struct expression *arg;
	struct expression_list *arglist = expr->args;
	(void)cost;

	FOR_EACH_PTR (arglist, arg) {
		/*
		 * Constant strings get printed out as a warning. By the
		 * time we get here, the EXPR_STRING has been fully 
		 * evaluated, so by now it's an anonymous symbol with a
		 * string initializer.
		 *
		 * Just for the heck of it, allow any constant string
		 * symbol.
		 */
		if (arg->type == EXPR_SYMBOL) {
			struct symbol *sym = arg->symbol;
			if (sym->initializer && sym->initializer->type == EXPR_STRING) {
				struct string *string = sym->initializer->string;
				dmrC_warning(C, expr->pos, "%*s", string->length-1, string->data);
			}
			continue;
		}

		/*
		 * Any other argument is a conditional. If it's
		 * non-constant, or it is false, we exit and do
		 * not print any warning.
		 */
		if (arg->type != EXPR_VALUE)
			goto out;
		if (!arg->value)
			goto out;
	} END_FOR_EACH_PTR(arg);
out:
	expr->type = EXPR_VALUE;
	expr->value = 1;
	expr->taint = 0;
	return 0;
}